

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom_test.cc
# Opt level: O3

void anon_unknown.dwarf_52fc::GetTrace
               (vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                *out_trace,uint flags,function<void_()> *thunk)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  bool bVar5;
  __pid_t _Var6;
  int iVar7;
  long lVar8;
  int *piVar9;
  size_t sVar10;
  undefined8 extraout_RAX;
  undefined1 auVar11 [8];
  pointer *__ptr;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  uint uVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  char *pcVar16;
  pointer pcVar17;
  char *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__n;
  ulong uVar18;
  undefined8 *__src;
  bool bVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  int child_pid;
  string filename;
  int status;
  uint64_t socket_read_bytes;
  Event e;
  regs regs;
  uint local_39c;
  undefined1 local_398 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  AssertHelper local_378;
  _Alloc_hider local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_368;
  uint local_35c;
  int local_358;
  uint local_354;
  vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_> *local_350;
  uint local_344;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  uint local_338;
  int local_334;
  AssertHelper local_330;
  undefined1 local_328 [8];
  undefined8 local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  size_type local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300 [5];
  undefined8 local_2b0;
  undefined1 local_130 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  int local_120;
  undefined4 uStack_11c;
  uint local_118;
  undefined4 uStack_114;
  int local_110;
  undefined1 local_108 [216];
  
  local_39c = fork();
  local_130._0_4_ = 0xffffffff;
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_328,"-1","child_pid",(int *)local_130,(int *)&local_39c);
  if (local_328[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_130);
    if (local_320 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar17 = "";
    }
    else {
      pcVar17 = (local_320->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_398,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
               ,0x18a,pcVar17);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_398,(Message *)local_130);
  }
  else {
    if (local_320 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_320,local_320);
    }
    if (local_39c == 0) {
      lVar8 = ptrace(PTRACE_TRACEME,0,0,0);
      if (lVar8 != 0) {
        _GLOBAL__N_1::GetTrace();
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
        if (local_398 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_398 + 8))();
        }
        if (local_320 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_320,local_320);
        }
        _Unwind_Resume(extraout_RAX);
      }
      raise(0x13);
      std::function<void_()>::operator()(thunk);
      _exit(0);
    }
    _Var6 = waitpid(local_39c,(int *)&local_35c,0);
    local_130._0_4_ = _Var6;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_328,"child_pid","waitpid(child_pid, &status, 0)",(int *)&local_39c,
               (int *)local_130);
    if (local_328[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_130);
      if (local_320 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar17 = "";
      }
      else {
        pcVar17 = (local_320->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_398,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                 ,0x199,pcVar17);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_398,(Message *)local_130);
    }
    else {
      if (local_320 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_320,local_320);
      }
      local_130[0] = (short)local_35c == 0x137f;
      local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((short)local_35c != 0x137f) {
        testing::Message::Message((Message *)local_398);
        this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_128;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)local_398 + 0x10),"Child was not stopped with SIGSTOP: ",0x24);
        std::ostream::operator<<((ostream *)((long)local_398 + 0x10),local_35c);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_328,(internal *)local_130,
                   (AssertionResult *)
                   "(((status) & 0xff) == 0x7f) && (((status) & 0xff00) >> 8) == 19","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_370,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                   ,0x19a,(char *)local_328);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_370,(Message *)local_398);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
        if (local_328 != (undefined1  [8])&local_318) {
          operator_delete((void *)local_328,
                          CONCAT44(local_318._M_allocated_capacity._4_4_,
                                   local_318._M_allocated_capacity._0_4_) + 1);
        }
        if (local_398 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_398 + 8))();
        }
        pbVar15 = local_128;
        if (local_128 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          return;
        }
        goto LAB_0011d38a;
      }
      local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffff00000000);
      local_130 = (undefined1  [8])ptrace(PTRACE_SETOPTIONS,(ulong)local_39c,0,0x100001);
      testing::internal::CmpHelperEQ<int,long>
                ((internal *)local_328,"0",
                 "ptrace(PTRACE_SETOPTIONS, child_pid, nullptr, (1 << 20) | PTRACE_O_TRACESYSGOOD)",
                 (int *)local_398,(long *)local_130);
      if (local_328[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_130);
        piVar9 = __errno_location();
        pcVar16 = strerror(*piVar9);
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)local_130 + 0x10);
        if (pcVar16 == (char *)0x0) {
          sVar10 = 6;
          pcVar16 = "(null)";
        }
        else {
          sVar10 = strlen(pcVar16);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)paVar13->_M_local_buf,pcVar16,sVar10);
        if (local_320 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar17 = "";
        }
        else {
          pcVar17 = (local_320->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_398,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                   ,0x1a3,pcVar17);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_398,(Message *)local_130);
      }
      else {
        if (local_320 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_320,local_320);
        }
        local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffff00000000);
        local_130 = (undefined1  [8])ptrace(PTRACE_SYSCALL,(ulong)local_39c,0,0);
        testing::internal::CmpHelperEQ<int,long>
                  ((internal *)local_328,"0","ptrace(PTRACE_SYSCALL, child_pid, 0, 0)",
                   (int *)local_398,(long *)local_130);
        if (local_328[0] == (internal)0x1) {
          local_334 = -1;
          local_358 = -1;
          local_350 = out_trace;
          do {
            if (local_320 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_320,local_320);
            }
            _Var6 = waitpid(local_39c,(int *)&local_35c,0);
            local_130._0_4_ = _Var6;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_328,"child_pid","waitpid(child_pid, &status, 0)",
                       (int *)&local_39c,(int *)local_130);
            if (local_328[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_130);
              if (local_320 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar17 = "";
              }
              else {
                pcVar17 = (local_320->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)local_398,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x1b1,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)local_398,(Message *)local_130);
              goto LAB_0011d358;
            }
            if (local_320 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_320,local_320);
            }
            if ((short)local_35c == 0x67f) {
              local_328._0_4_ = kAbort;
              local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              local_318._M_allocated_capacity._0_4_ = 0;
              local_308 = 0;
              local_300[0]._M_local_buf[0] = '\0';
              local_318._8_8_ = local_300;
              std::
              vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>::
              push_back(out_trace,(value_type *)local_328);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._8_8_ == local_300) {
                return;
              }
              operator_delete((void *)local_318._8_8_,
                              CONCAT71(local_300[0]._M_allocated_capacity._1_7_,
                                       local_300[0]._M_local_buf[0]) + 1);
              return;
            }
            local_130[0] = (short)local_35c == -0x7a81;
            local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((short)local_35c != -0x7a81) {
              testing::Message::Message((Message *)local_398);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)((long)local_398 + 0x10),
                         "Child was not stopped with a syscall stop: ",0x2b);
              std::ostream::operator<<((ostream *)((long)local_398 + 0x10),local_35c);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_328,(internal *)local_130,
                         (AssertionResult *)
                         "(((status) & 0xff) == 0x7f) && (((status) & 0xff00) >> 8) == (5 | 0x80)",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_370,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x1ba,(char *)local_328);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_370,(Message *)local_398);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
              if (local_328 != (undefined1  [8])&local_318) {
                operator_delete((void *)local_328,
                                CONCAT44(local_318._M_allocated_capacity._4_4_,
                                         local_318._M_allocated_capacity._0_4_) + 1);
              }
              if (local_398 != (undefined1  [8])0x0) {
                (**(code **)(*(size_type *)local_398 + 8))();
              }
              if (local_128 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                return;
              }
              this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_128;
              pbVar15 = local_128;
              goto LAB_0011d38a;
            }
            bVar5 = regs_read((regs *)local_130,local_39c);
            uVar14 = local_39c;
            local_398[0] = (internal)bVar5;
            local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar5) {
              testing::Message::Message((Message *)&local_370);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_328,(internal *)local_398,
                         (AssertionResult *)"regs_read(&regs, child_pid)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_378,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x1be,(char *)local_328);
              testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_370);
              goto LAB_0011d9f6;
            }
            local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if ((long)local_130 < 0x29) {
              if (local_130 != (undefined1  [8])0x0) {
                if (local_130 == (undefined1  [8])0x2) goto LAB_0011c89f;
                if (((local_130 == (undefined1  [8])0x3) && (-1 < local_358)) &&
                   (local_358 == (int)local_128)) {
                  local_328._0_4_ = 6;
                  local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  local_318._M_allocated_capacity._0_4_ = 0;
                  local_308 = 0;
                  local_300[0]._M_local_buf[0] = '\0';
                  local_318._8_8_ = local_300;
                  std::
                  vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ::push_back(out_trace,(Event *)local_328);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_318._8_8_ != local_300) {
                    operator_delete((void *)local_318._8_8_,
                                    CONCAT71(local_300[0]._M_allocated_capacity._1_7_,
                                             local_300[0]._M_local_buf[0]) + 1);
                  }
                  local_358 = -1;
                }
                goto LAB_0011cc45;
              }
              if (local_334 == (int)local_128 && -1 < local_334) {
                local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(uStack_114,local_118);
                local_328._0_4_ = 2;
                local_318._M_allocated_capacity._0_4_ = 0;
                local_308 = 0;
                local_300[0]._M_local_buf[0] = '\0';
                local_318._8_8_ = local_300;
                std::
                vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ::push_back(out_trace,(Event *)local_328);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._8_8_ != local_300) {
                  operator_delete((void *)local_318._8_8_,
                                  CONCAT71(local_300[0]._M_allocated_capacity._1_7_,
                                           local_300[0]._M_local_buf[0]) + 1);
                }
                uVar14 = 0xffffffea;
                bVar2 = false;
                bVar5 = false;
                bVar1 = false;
                if ((flags & 0x10) != 0) goto LAB_0011ccfc;
                bVar1 = false;
                bVar5 = false;
LAB_0011cd54:
                bVar3 = false;
                out_trace = local_350;
                goto LAB_0011cd59;
              }
              if (local_358 != (int)local_128 || local_358 < 0) goto LAB_0011cc45;
              pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        CONCAT44(uStack_114,local_118);
              local_328._0_4_ = 5;
              local_318._M_allocated_capacity._0_4_ = 0;
              local_308 = 0;
              local_300[0]._M_local_buf[0] = '\0';
              local_320 = pbVar15;
              local_318._8_8_ = local_300;
              std::
              vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>::
              push_back(out_trace,(Event *)local_328);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_318._8_8_ != local_300) {
                operator_delete((void *)local_318._8_8_,
                                CONCAT71(local_300[0]._M_allocated_capacity._1_7_,
                                         local_300[0]._M_local_buf[0]) + 1);
              }
              if ((char)flags < '\0') {
                uVar14 = 0xffffffea;
                goto LAB_0011ccf6;
              }
              bVar3 = true;
              local_340 = pbVar15;
              if ((flags >> 8 & 1) == 0) {
LAB_0011cc3f:
                goto LAB_0011cc48;
              }
              local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffff00000000);
              testing::internal::CmpHelperGT<unsigned_long,unsigned_int>
                        ((internal *)local_328,"socket_read_bytes","0u",(unsigned_long *)&local_340,
                         (uint *)local_398);
              if (local_328[0] != (internal)0x0) {
                if (local_320 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_320,local_320);
                }
                local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&local_340[-1].field_2 + 0xf);
                flags = flags & 0xfffffe7f;
                goto LAB_0011cc3f;
              }
              testing::Message::Message((Message *)local_398);
              if (local_320 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar17 = "";
              }
              else {
                pcVar17 = (local_320->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_370,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x1ff,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_370,(Message *)local_398);
LAB_0011d97f:
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_370);
              auVar11 = local_398;
              goto LAB_0011d36a;
            }
            if ((long)local_130 < 0x101) {
              if (local_130 == (undefined1  [8])0x29) {
                if (((int)local_128 == 1) && (local_120 == 1)) {
                  local_328._0_4_ = 3;
                  local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0;
                  local_318._M_allocated_capacity._0_4_ = 0;
                  local_308 = 0;
                  local_300[0]._M_local_buf[0] = '\0';
                  local_318._8_8_ = local_300;
                  std::
                  vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ::push_back(out_trace,(Event *)local_328);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_318._8_8_ != local_300) {
                    operator_delete((void *)local_318._8_8_,
                                    CONCAT71(local_300[0]._M_allocated_capacity._1_7_,
                                             local_300[0]._M_local_buf[0]) + 1);
                  }
                  uVar14 = 0xffffffea;
                  bVar2 = true;
                  bVar5 = false;
                  bVar1 = bVar2;
                  if ((flags & 0x20) == 0) goto LAB_0011cb3a;
                  goto LAB_0011ccfc;
                }
              }
              else if (((local_130 == (undefined1  [8])0x2a) && (-1 < local_358)) &&
                      (local_358 == (int)local_128)) {
                local_328._0_4_ = 4;
                local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                local_318._M_allocated_capacity._0_4_ = 0;
                local_308 = 0;
                local_300[0]._M_local_buf[0] = '\0';
                local_318._8_8_ = local_300;
                std::
                vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ::push_back(out_trace,(Event *)local_328);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._8_8_ != local_300) {
                  operator_delete((void *)local_318._8_8_,
                                  CONCAT71(local_300[0]._M_allocated_capacity._1_7_,
                                           local_300[0]._M_local_buf[0]) + 1);
                }
                uVar14 = (int)(flags << 0x19) >> 0x1f & 0xffffffea;
LAB_0011ccf6:
                bVar5 = false;
                bVar1 = false;
LAB_0011ccfc:
                bVar2 = bVar1;
                uVar4 = local_39c;
                memcpy((Event *)local_328,local_108,0xd8);
                local_2b0 = 0xffffffffffffffff;
                lVar8 = ptrace(PTRACE_SETREGS,(ulong)uVar4,0,(Event *)local_328);
                local_398[0] = (internal)(lVar8 == 0);
                local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if (lVar8 == 0) {
                  bVar1 = true;
                  local_354 = uVar14;
                  goto LAB_0011cd54;
                }
                testing::Message::Message((Message *)&local_370);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_328,(internal *)local_398,
                           (AssertionResult *)"regs_break_syscall(child_pid, &regs)","false","true",
                           in_R9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_378,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                           ,0x22f,(char *)local_328);
                testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_370);
                goto LAB_0011d9f6;
              }
            }
            else {
              if (local_130 == (undefined1  [8])0x101) {
LAB_0011c89f:
                pbVar15 = (&local_128)[local_130 == (undefined1  [8])0x101];
                local_398 = (undefined1  [8])&local_388;
                local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                local_388._M_local_buf[0] = '\0';
                local_328 = (undefined1  [8])
                            ptrace(PTRACE_PEEKDATA,(ulong)local_39c,
                                   (ulong)pbVar15 & 0xfffffffffffffff8,0);
                cVar20 = local_328[(uint)pbVar15 & 7];
                while (cVar20 != '\0') {
                  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar15->_M_dataplus)._M_p + 1);
                  std::__cxx11::string::push_back((char)local_398);
                  local_328 = (undefined1  [8])
                              ptrace(PTRACE_PEEKDATA,(ulong)uVar14,
                                     (ulong)pbVar15 & 0xfffffffffffffff8,0);
                  cVar20 = local_328[(uint)pbVar15 & 7];
                }
                lVar8 = std::__cxx11::string::find((char *)local_398,0x1bd483,0);
                if (lVar8 != 0) {
                  Event::Open((Event *)local_328,(string *)local_398);
                  std::
                  vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                  ::push_back(out_trace,(Event *)local_328);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_318._8_8_ != local_300) {
                    operator_delete((void *)local_318._8_8_,
                                    CONCAT71(local_300[0]._M_allocated_capacity._1_7_,
                                             local_300[0]._M_local_buf[0]) + 1);
                  }
                }
                iVar7 = std::__cxx11::string::compare((char *)local_398);
                bVar5 = iVar7 == 0;
                if (local_398 != (undefined1  [8])&local_388) {
                  operator_delete((void *)local_398,
                                  CONCAT71(local_388._M_allocated_capacity._1_7_,
                                           local_388._M_local_buf[0]) + 1);
                }
                bVar2 = false;
                uVar14 = 0xfffffffe;
                bVar1 = bVar2;
                if (((byte)((flags & 2) >> 1) & bVar5) == 0) {
LAB_0011cb3a:
                  bVar1 = false;
                  goto LAB_0011cd54;
                }
                goto LAB_0011ccfc;
              }
              if (local_130 == (undefined1  [8])0x13e) {
                uVar12 = 1;
                uVar14 = 0xffffffda;
                if (((flags & 1) == 0) && (uVar14 = 0xffffffea, (flags & 8) == 0)) {
                  uVar14 = local_354;
                  if ((flags & 4) == 0) {
                    uVar12 = 0;
                  }
                  else {
                    uVar12 = CONCAT44(uStack_114,local_118);
                    if ((local_118 & 1) != 0) {
                      uVar14 = 0xfffffff5;
                    }
                  }
                }
                local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(uStack_11c,local_120);
                local_328 = (undefined1  [8])((ulong)(uint)local_328._4_4_ << 0x20);
                local_308 = 0;
                local_300[0]._M_local_buf[0] = '\0';
                local_318._M_allocated_capacity._0_4_ = local_118;
                local_318._8_8_ = local_300;
                std::
                vector<(anonymous_namespace)::Event,_std::allocator<(anonymous_namespace)::Event>_>
                ::push_back(local_350,(Event *)local_328);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_318._8_8_ != local_300) {
                  operator_delete((void *)local_318._8_8_,
                                  CONCAT71(local_300[0]._M_allocated_capacity._1_7_,
                                           local_300[0]._M_local_buf[0]) + 1);
                }
                bVar2 = false;
                bVar5 = false;
                bVar1 = false;
                if ((uVar12 & 1) == 0) {
                  bVar1 = false;
                  bVar5 = false;
                  local_354 = uVar14;
                  goto LAB_0011cd54;
                }
                goto LAB_0011ccfc;
              }
            }
LAB_0011cc45:
            bVar3 = false;
LAB_0011cc48:
            bVar1 = false;
            bVar2 = false;
            bVar5 = false;
LAB_0011cd59:
            local_370._M_p = (pointer)((ulong)local_370._M_p._4_4_ << 0x20);
            local_398 = (undefined1  [8])ptrace(PTRACE_SYSCALL,(ulong)local_39c,0,0);
            testing::internal::CmpHelperEQ<int,long>
                      ((internal *)local_328,"0","ptrace(PTRACE_SYSCALL, child_pid, 0, 0)",
                       (int *)&local_370,(long *)local_398);
            if (local_328[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_398);
              if (local_320 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar17 = "";
              }
              else {
                pcVar17 = (local_320->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_370,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x232,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_370,(Message *)local_398);
              goto LAB_0011d97f;
            }
            if (local_320 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_320,local_320);
            }
            _Var6 = waitpid(local_39c,(int *)&local_35c,0);
            local_398._0_4_ = _Var6;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_328,"child_pid","waitpid(child_pid, &status, 0)",
                       (int *)&local_39c,(int *)local_398);
            if (local_328[0] == (internal)0x0) {
              testing::Message::Message((Message *)local_398);
              if (local_320 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar17 = "";
              }
              else {
                pcVar17 = (local_320->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&local_370,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x233,pcVar17);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&local_370,(Message *)local_398);
              goto LAB_0011d97f;
            }
            if (local_320 !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_320,local_320);
            }
            if ((local_35c & 0x7f) == 0) {
              local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffff00000000);
              local_370._M_p =
                   (pointer)(CONCAT44(local_370._M_p._4_4_,local_35c >> 8) & 0xffffffff000000ff);
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)local_328,"0","(((status) & 0xff00) >> 8)",(int *)local_398,
                         (int *)&local_370);
              if (local_328[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_398);
                if (local_320 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar17 = "";
                }
                else {
                  pcVar17 = (local_320->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&local_370,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                           ,0x237,pcVar17);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&local_370,(Message *)local_398);
                goto LAB_0011d97f;
              }
              goto LAB_0011d375;
            }
            bVar19 = (local_35c & 0xffff) == 0x857f;
            local_398[0] = (internal)bVar19;
            local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar19) {
              testing::Message::Message((Message *)&local_370);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_328,(internal *)local_398,
                         (AssertionResult *)
                         "(((status) & 0xff) == 0x7f) && (((status) & 0xff00) >> 8) == (5 | 0x80)",
                         "false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_378,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x23e,(char *)local_328);
              testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_370);
LAB_0011d9f6:
              testing::internal::AssertHelper::~AssertHelper(&local_378);
              if (local_328 != (undefined1  [8])&local_318) {
                operator_delete((void *)local_328,
                                CONCAT44(local_318._M_allocated_capacity._4_4_,
                                         local_318._M_allocated_capacity._0_4_) + 1);
              }
LAB_0011da21:
              if ((long *)local_370._M_p != (long *)0x0) {
                (**(code **)(*(long *)local_370._M_p + 8))();
              }
              if (local_390 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                return;
              }
              this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_390;
              pbVar15 = local_390;
              goto LAB_0011d38a;
            }
            if (bVar1) {
              bVar5 = regs_set_ret(local_39c,local_354);
              local_398[0] = (internal)bVar5;
              local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              if (bVar5) goto LAB_0011d0bc;
              testing::Message::Message((Message *)&local_370);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_328,(internal *)local_398,
                         (AssertionResult *)"regs_set_ret(child_pid, force_result.value())","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_378,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x241,(char *)local_328);
              testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_370);
              goto LAB_0011d9f6;
            }
            if (!bVar5) {
              if (bVar2) {
                bVar5 = regs_read((regs *)local_130,local_39c);
                local_398[0] = (internal)bVar5;
                local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if (!bVar5) {
                  testing::Message::Message((Message *)&local_370);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)local_328,(internal *)local_398,
                             (AssertionResult *)"regs_read(&regs, child_pid)","false","true",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_378,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                             ,0x246,(char *)local_328);
                  testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_370);
                  goto LAB_0011d9f6;
                }
                local_358 = local_110;
                goto LAB_0011d0bc;
              }
              if (!bVar3) goto LAB_0011d0b4;
              local_370._M_p = &DAT_000001f0;
              testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                        ((internal *)local_398,"socket_read_bytes","sizeof(entropy)",
                         (unsigned_long *)&local_340,(unsigned_long *)&local_370);
              __src = (undefined8 *)local_328;
              if (local_398[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_370);
                if (local_390 ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar17 = "";
                }
                else {
                  pcVar17 = (local_390->_M_dataplus)._M_p;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_378,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                           ,0x24c,pcVar17);
                testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_370);
                testing::internal::AssertHelper::~AssertHelper(&local_378);
                goto LAB_0011da21;
              }
              if (local_390 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&local_390,local_390);
              }
              lVar8 = 0;
              cVar20 = '\0';
              cVar21 = '\x01';
              cVar22 = '\x02';
              cVar23 = '\x03';
              cVar24 = '\x04';
              cVar25 = '\x05';
              cVar26 = '\x06';
              cVar27 = '\a';
              cVar28 = '\b';
              cVar29 = '\t';
              cVar30 = '\n';
              cVar31 = '\v';
              cVar32 = '\f';
              cVar33 = '\r';
              cVar34 = '\x0e';
              cVar35 = '\x0f';
              do {
                local_328[lVar8] = cVar20;
                local_328[lVar8 + 1] = cVar21;
                local_328[lVar8 + 2] = cVar22;
                local_328[lVar8 + 3] = cVar23;
                local_328[lVar8 + 4] = cVar24;
                local_328[lVar8 + 5] = cVar25;
                local_328[lVar8 + 6] = cVar26;
                local_328[lVar8 + 7] = cVar27;
                *(char *)((long)&local_320 + lVar8) = cVar28;
                *(char *)((long)&local_320 + lVar8 + 1) = cVar29;
                *(char *)((long)&local_320 + lVar8 + 2) = cVar30;
                *(char *)((long)&local_320 + lVar8 + 3) = cVar31;
                *(char *)((long)&local_320 + lVar8 + 4) = cVar32;
                *(char *)((long)&local_320 + lVar8 + 5) = cVar33;
                *(char *)((long)&local_320 + lVar8 + 6) = cVar34;
                *(char *)((long)&local_320 + lVar8 + 7) = cVar35;
                lVar8 = lVar8 + 0x10;
                cVar20 = cVar20 + '\x10';
                cVar21 = cVar21 + '\x10';
                cVar22 = cVar22 + '\x10';
                cVar23 = cVar23 + '\x10';
                cVar24 = cVar24 + '\x10';
                cVar25 = cVar25 + '\x10';
                cVar26 = cVar26 + '\x10';
                cVar27 = cVar27 + '\x10';
                cVar28 = cVar28 + '\x10';
                cVar29 = cVar29 + '\x10';
                cVar30 = cVar30 + '\x10';
                cVar31 = cVar31 + '\x10';
                cVar32 = cVar32 + '\x10';
                cVar33 = cVar33 + '\x10';
                cVar34 = cVar34 + '\x10';
                cVar35 = cVar35 + '\x10';
              } while (lVar8 != 0x1f0);
              if (local_340 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                uVar12 = CONCAT44(uStack_11c,local_120);
                local_344 = local_39c;
                pbVar15 = local_340;
                local_338 = flags;
                do {
                  uVar18 = (ulong)((uint)uVar12 & 7);
                  __n = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (8 - uVar18);
                  if (pbVar15 < __n) {
                    __n = pbVar15;
                  }
                  if (__n == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x8) {
                    auVar11 = (undefined1  [8])*__src;
                  }
                  else {
                    local_398 = (undefined1  [8])
                                ptrace(PTRACE_PEEKDATA,(ulong)local_344,uVar12 & 0xfffffffffffffff8,
                                       0);
                    memcpy(local_398 + uVar18,__src,(size_t)__n);
                    auVar11 = local_398;
                  }
                  local_378.data_._0_4_ = 0;
                  local_370._M_p =
                       (pointer)ptrace(PTRACE_POKEDATA,(ulong)local_344,uVar12 & 0xfffffffffffffff8,
                                       auVar11);
                  testing::internal::CmpHelperEQ<int,long>
                            ((internal *)local_398,"0",
                             "ptrace(PTRACE_POKEDATA, child_pid, reinterpret_cast<void *>(aligned_addr), reinterpret_cast<void *>(word))"
                             ,(int *)&local_378,(long *)&local_370);
                  flags = local_338;
                  if (local_398[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_370);
                    flags = local_338;
                    pcVar16 = "";
                    if (local_390 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar16 = (local_390->_M_dataplus)._M_p;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_378,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                               ,0x15c,pcVar16);
                    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_370);
                    testing::internal::AssertHelper::~AssertHelper(&local_378);
                    if ((long *)local_370._M_p != (long *)0x0) {
                      (**(code **)(*(long *)local_370._M_p + 8))();
                    }
                    if (local_390 !=
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_390,local_390);
                    }
                    break;
                  }
                  if (local_390 !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_390,local_390);
                  }
                  __src = (undefined8 *)((long)__src + (long)__n);
                  uVar12 = (long)&(__n->_M_dataplus)._M_p + uVar12;
                  pbVar15 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)pbVar15 - (long)__n);
                } while (pbVar15 !=
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              }
              bVar5 = regs_set_ret(local_39c,(int)local_340);
              local_370._M_p._0_1_ = bVar5;
              local_368 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              out_trace = local_350;
              if (bVar5) goto LAB_0011d0bc;
              testing::Message::Message((Message *)&local_378);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_398,(internal *)&local_370,
                         (AssertionResult *)"regs_set_ret(child_pid, socket_read_bytes)","false",
                         "true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_330,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x253,(char *)local_398);
              testing::internal::AssertHelper::operator=(&local_330,(Message *)&local_378);
              testing::internal::AssertHelper::~AssertHelper(&local_330);
              if (local_398 != (undefined1  [8])&local_388) {
                operator_delete((void *)local_398,
                                CONCAT71(local_388._M_allocated_capacity._1_7_,
                                         local_388._M_local_buf[0]) + 1);
              }
              if ((long *)CONCAT44(local_378.data_._4_4_,local_378.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_378.data_._4_4_,local_378.data_._0_4_) + 8))();
              }
              if (local_368 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                return;
              }
              this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_368;
              pbVar15 = local_368;
              goto LAB_0011d38a;
            }
            bVar5 = regs_read((regs *)local_130,local_39c);
            local_398[0] = (internal)bVar5;
            local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (!bVar5) {
              testing::Message::Message((Message *)&local_370);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_328,(internal *)local_398,
                         (AssertionResult *)"regs_read(&regs, child_pid)","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_378,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                         ,0x243,(char *)local_328);
              testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_370);
              goto LAB_0011d9f6;
            }
            local_334 = local_110;
LAB_0011d0b4:
            local_390 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
LAB_0011d0bc:
            local_398 = (undefined1  [8])((ulong)local_398 & 0xffffffff00000000);
            local_130 = (undefined1  [8])ptrace(PTRACE_SYSCALL,(ulong)local_39c,0,0);
            testing::internal::CmpHelperEQ<int,long>
                      ((internal *)local_328,"0","ptrace(PTRACE_SYSCALL, child_pid, 0, 0)",
                       (int *)local_398,(long *)local_130);
          } while (local_328[0] != (internal)0x0);
        }
        testing::Message::Message((Message *)local_130);
        if (local_320 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar17 = "";
        }
        else {
          pcVar17 = (local_320->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_398,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/rand/urandom_test.cc"
                   ,0x1b0,pcVar17);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_398,(Message *)local_130);
      }
    }
  }
LAB_0011d358:
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_398);
  auVar11 = local_130;
LAB_0011d36a:
  if (auVar11 != (undefined1  [8])0x0) {
    (**(code **)(*(size_type *)auVar11 + 8))();
  }
LAB_0011d375:
  if (local_320 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  this = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&local_320;
  pbVar15 = local_320;
LAB_0011d38a:
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this,pbVar15);
  return;
}

Assistant:

static void GetTrace(std::vector<Event> *out_trace, unsigned flags,
                     std::function<void()> thunk) {
  const int child_pid = fork();
  ASSERT_NE(-1, child_pid);

  if (child_pid == 0) {
    // Child process
    if (ptrace(PTRACE_TRACEME, 0, 0, 0) != 0) {
      perror("PTRACE_TRACEME");
      _exit(1);
    }
    raise(SIGSTOP);
    thunk();
    _exit(0);
  }

  // Parent process
  int status;
  ASSERT_EQ(child_pid, waitpid(child_pid, &status, 0));
  ASSERT_TRUE(WIFSTOPPED(status) && WSTOPSIG(status) == SIGSTOP)
      << "Child was not stopped with SIGSTOP: " << status;

  // Set options so that:
  //   a) the child process is killed once this process dies.
  //   b) System calls result in a WSTOPSIG value of (SIGTRAP | 0x80) rather
  //      than just SIGTRAP. (This doesn't matter here, but it's recommended
  //      practice so that it's distinct from the signal itself.)
  ASSERT_EQ(0, ptrace(PTRACE_SETOPTIONS, child_pid, nullptr,
                      PTRACE_O_EXITKILL | PTRACE_O_TRACESYSGOOD))
      << strerror(errno);

  // urandom_fd tracks the file descriptor number for /dev/urandom in the child
  // process, if it opens it.
  int urandom_fd = -1;

  // sock_fd tracks the file descriptor number for the socket to the entropy
  // daemon, if one is opened.
  int sock_fd = -1;

  for (;;) {
    // Advance the child to the next system call.
    ASSERT_EQ(0, ptrace(PTRACE_SYSCALL, child_pid, 0, 0));
    ASSERT_EQ(child_pid, waitpid(child_pid, &status, 0));

    // The child may have aborted rather than made a system call.
    if (WIFSTOPPED(status) && WSTOPSIG(status) == SIGABRT) {
      out_trace->push_back(Event::Abort());
      break;
    }

    // Otherwise the only valid ptrace event is a system call stop.
    ASSERT_TRUE(WIFSTOPPED(status) && WSTOPSIG(status) == (SIGTRAP | 0x80))
        << "Child was not stopped with a syscall stop: " << status;

    struct regs regs;
    ASSERT_TRUE(regs_read(&regs, child_pid));

    bool is_opening_urandom = false;
    bool is_socket_call = false;
    bool is_socket_read = false;
    uint64_t socket_read_bytes = 0;
    // force_result is unset to indicate that the system call should run
    // normally. Otherwise it's, e.g. -EINVAL, to indicate that the system call
    // should not run and that the given value should be injected on return.
    std::optional<int> force_result;

    switch (regs.syscall) {
      case __NR_getrandom:
        if (flags & NO_GETRANDOM) {
          force_result = -ENOSYS;
        } else if (flags & GETRANDOM_ERROR) {
          force_result = -EINVAL;
        } else if (flags & GETRANDOM_NOT_READY) {
          if (regs.args[2] & GRND_NONBLOCK) {
            force_result = -EAGAIN;
          }
        }
        out_trace->push_back(
            Event::GetRandom(/*length=*/regs.args[1], /*flags=*/regs.args[2]));
        break;

      case __NR_openat:
#if defined(OPENSSL_X86_64)
      case __NR_open:
#endif
      {
        uintptr_t filename_ptr =
            (regs.syscall == __NR_openat) ? regs.args[1] : regs.args[0];
        const std::string filename =
            get_string_from_remote(child_pid, filename_ptr);
        if (filename.find("/dev/__properties__/") == 0) {
          // Android may try opening these files as part of SELinux support.
          // They are ignored here.
        } else {
          out_trace->push_back(Event::Open(filename));
        }
        is_opening_urandom = (filename == "/dev/urandom");
        if (is_opening_urandom && (flags & NO_URANDOM)) {
          force_result = -ENOENT;
        }
        break;
      }

      case __NR_read: {
        const int read_fd = regs.args[0];
        if (urandom_fd >= 0 && urandom_fd == read_fd) {
          out_trace->push_back(Event::UrandomRead(/*length=*/regs.args[2]));
          if (flags & URANDOM_ERROR) {
            force_result = -EINVAL;
          }
        } else if (sock_fd >= 0 && sock_fd == read_fd) {
          uint64_t length = regs.args[2];
          out_trace->push_back(Event::SocketRead(length));
          if (flags & SOCKET_READ_ERROR) {
            force_result = -EINVAL;
          } else {
            is_socket_read = true;
            socket_read_bytes = length;

            if (flags & SOCKET_READ_SHORT) {
              ASSERT_GT(socket_read_bytes, 0u);
              socket_read_bytes--;
              flags &= ~SOCKET_READ_SHORT;
            }
          }
        }
        break;
      }

      case __NR_close: {
        if (sock_fd >= 0 && static_cast<int>(regs.args[0]) == sock_fd) {
          out_trace->push_back(Event::SocketClose());
          sock_fd = -1;
        }
        break;
      }

      case __NR_socket: {
        const int family = regs.args[0];
        const int type = regs.args[1];
        if (family == AF_UNIX && type == SOCK_STREAM) {
          out_trace->push_back(Event::Socket());
          is_socket_call = true;
          if (flags & SOCKET_ERROR) {
            force_result = -EINVAL;
          }
        }
        break;
      }

      case __NR_connect: {
        const int connect_fd = regs.args[0];
        if (sock_fd >= 0 && connect_fd == sock_fd) {
          out_trace->push_back(Event::Connect());
          if (flags & CONNECT_ERROR) {
            force_result = -EINVAL;
          } else {
            // The test system might not have an entropy daemon running so
            // inject a success result.
            force_result = 0;
          }
        }

        break;
      }
    }

    if (force_result.has_value()) {
      ASSERT_TRUE(regs_break_syscall(child_pid, &regs));
    }

    ASSERT_EQ(0, ptrace(PTRACE_SYSCALL, child_pid, 0, 0));
    ASSERT_EQ(child_pid, waitpid(child_pid, &status, 0));
    // If the system call was exit/exit_group, the process may be terminated
    // rather than have exited the system call.
    if (WIFEXITED(status)) {
      ASSERT_EQ(0, WEXITSTATUS(status));
      return;
    }

    // Otherwise the next state must be a system call exit stop. This is
    // indistinguishable from a system call entry, we just have to keep track
    // and know that these events happen in pairs.
    ASSERT_TRUE(WIFSTOPPED(status) && WSTOPSIG(status) == (SIGTRAP | 0x80));

    if (force_result.has_value()) {
      ASSERT_TRUE(regs_set_ret(child_pid, force_result.value()));
    } else if (is_opening_urandom) {
      ASSERT_TRUE(regs_read(&regs, child_pid));
      urandom_fd = regs.ret;
    } else if (is_socket_call) {
      ASSERT_TRUE(regs_read(&regs, child_pid));
      sock_fd = regs.ret;
    } else if (is_socket_read) {
      // Simulate a response from the entropy daemon since it might not be
      // running on the current system.
      uint8_t entropy[kDaemonWriteLength];
      ASSERT_LE(socket_read_bytes, sizeof(entropy));

      for (size_t i = 0; i < sizeof(entropy); i++) {
        entropy[i] = i & 0xff;
      }
      memcpy_to_remote(child_pid, regs.args[1], entropy, socket_read_bytes);

      ASSERT_TRUE(regs_set_ret(child_pid, socket_read_bytes));
    }
  }
}